

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

_Bool init_angband(void)

{
  int local_c;
  wchar_t i;
  
  event_signal(EVENT_ENTER_INIT);
  init_game_constants();
  for (local_c = 0; modules[local_c] != (init_module *)0x0; local_c = local_c + 1) {
    if (modules[local_c]->init != (_func_void *)0x0) {
      (*modules[local_c]->init)();
    }
  }
  event_signal_message(EVENT_INITSTATUS,L'\0',"Initializing other stuff...");
  monster_list_init();
  object_list_init();
  event_signal_message(EVENT_INITSTATUS,L'\0',"Getting the dice rolling...");
  Rand_init();
  return true;
}

Assistant:

bool init_angband(void)
{
	int i;

	event_signal(EVENT_ENTER_INIT);

	init_game_constants();

	/* Initialise modules */
	for (i = 0; modules[i]; i++)
		if (modules[i]->init)
			modules[i]->init();

	/* Initialize some other things */
	event_signal_message(EVENT_INITSTATUS, 0, "Initializing other stuff...");

	/* List display codes */
	monster_list_init();
	object_list_init();

	/* Initialise RNG */
	event_signal_message(EVENT_INITSTATUS, 0, "Getting the dice rolling...");
	Rand_init();

	return true;
}